

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * __thiscall cmdline::parser::usage_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  pointer ppoVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppoVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t i_1;
  string local_1c8 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"usage: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->prog_name);
  std::operator<<(poVar2," ");
  uVar5 = 0;
  while( true ) {
    ppoVar4 = (this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ordered).
                      super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar4 >> 3) <= uVar5)
    break;
    iVar1 = (*ppoVar4[uVar5]->_vptr_option_base[7])();
    if ((char)iVar1 != '\0') {
      (*(this->ordered).
        super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_option_base[0xb])(local_1c8);
      poVar2 = std::operator<<((ostream *)&oss,local_1c8);
      std::operator<<(poVar2," ");
      std::__cxx11::string::~string(local_1c8);
    }
    uVar5 = uVar5 + 1;
  }
  poVar2 = std::operator<<((ostream *)&oss,"[options] ... ");
  poVar2 = std::operator<<(poVar2,(string *)&this->ftr);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&oss,"options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar5 = 0;
  uVar6 = 0;
  while( true ) {
    ppoVar4 = (this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppoVar3 = (this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)ppoVar4 - (long)ppoVar3 >> 3) <= uVar6) break;
    iVar1 = (*ppoVar3[uVar6]->_vptr_option_base[8])();
    uVar7 = *(ulong *)(CONCAT44(extraout_var,iVar1) + 8);
    if (uVar5 <= uVar7) {
      uVar5 = uVar7;
    }
    uVar6 = uVar6 + 1;
  }
  for (uVar6 = 0; uVar6 < (ulong)((long)ppoVar4 - (long)ppoVar3 >> 3); uVar6 = uVar6 + 1) {
    iVar1 = (*ppoVar3[uVar6]->_vptr_option_base[9])();
    pcVar8 = "      ";
    poVar2 = (ostream *)&oss;
    if ((char)iVar1 != '\0') {
      poVar2 = std::operator<<((ostream *)&oss,"  -");
      iVar1 = (*(this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_option_base[9])();
      poVar2 = std::operator<<(poVar2,(char)iVar1);
      pcVar8 = ", ";
    }
    std::operator<<(poVar2,pcVar8);
    poVar2 = std::operator<<((ostream *)&oss,"--");
    iVar1 = (*(this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_option_base[8])();
    std::operator<<(poVar2,(string *)CONCAT44(extraout_var_00,iVar1));
    iVar1 = (*(this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_option_base[8])();
    for (uVar7 = *(ulong *)(CONCAT44(extraout_var_01,iVar1) + 8); uVar7 < uVar5 + 4;
        uVar7 = uVar7 + 1) {
      std::operator<<((ostream *)&oss,' ');
    }
    iVar1 = (*(this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_option_base[10])();
    poVar2 = std::operator<<((ostream *)&oss,(string *)CONCAT44(extraout_var_02,iVar1));
    std::endl<char,std::char_traits<char>>(poVar2);
    ppoVar3 = (this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppoVar4 = (this->ordered).
              super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string usage() const {
        std::ostringstream oss;
        oss << "usage: " << prog_name << " ";
        for (size_t i = 0; i < ordered.size(); i++) {
            if (ordered[i]->must()) oss << ordered[i]->short_description() << " ";
        }

        oss << "[options] ... " << ftr << std::endl;
        oss << "options:" << std::endl;

        size_t max_width = 0;
        for (size_t i = 0; i < ordered.size(); i++) {
            max_width = std::max(max_width, ordered[i]->name().length());
        }
        for (size_t i = 0; i < ordered.size(); i++) {
            if (ordered[i]->short_name()) {
                oss << "  -" << ordered[i]->short_name() << ", ";
            } else {
                oss << "      ";
            }

            oss << "--" << ordered[i]->name();
            for (size_t j = ordered[i]->name().length(); j < max_width + 4; j++) oss << ' ';
            oss << ordered[i]->description() << std::endl;
        }
        return oss.str();
    }